

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowest_lexicography.cpp
# Opt level: O2

int si9ma::cmp(void *param_1,void *param_2)

{
  bool bVar1;
  undefined7 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&bStack_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2);
  std::operator+(&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1);
  bVar1 = std::operator<(&bStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_58);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool cmp(const string &str1,const string &str2){
        return str1 + str2 < str2 + str1;
    }